

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

ArrayPtr<const_unsigned_char> * __thiscall
kj::Vector<kj::ArrayPtr<unsigned_char_const>>::add<kj::Array<unsigned_char>&>
          (Vector<kj::ArrayPtr<unsigned_char_const>> *this,Array<unsigned_char> *params)

{
  bool bVar1;
  Array<unsigned_char> *params_00;
  ArrayPtr<const_unsigned_char> *pAVar2;
  Array<unsigned_char> *params_local;
  Vector<kj::ArrayPtr<const_unsigned_char>_> *this_local;
  
  bVar1 = ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_>::isFull
                    ((ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> *)this);
  if (bVar1) {
    Vector<kj::ArrayPtr<const_unsigned_char>_>::grow
              ((Vector<kj::ArrayPtr<const_unsigned_char>_> *)this,0);
  }
  params_00 = fwd<kj::Array<unsigned_char>&>(params);
  pAVar2 = ArrayBuilder<kj::ArrayPtr<unsigned_char_const>>::add<kj::Array<unsigned_char>&>
                     ((ArrayBuilder<kj::ArrayPtr<unsigned_char_const>> *)this,params_00);
  return pAVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }